

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publickey.c
# Opt level: O0

void libssh2_publickey_list_free(LIBSSH2_PUBLICKEY *pkey,libssh2_publickey_list *pkey_list)

{
  LIBSSH2_SESSION *pLVar1;
  libssh2_publickey_list *local_28;
  libssh2_publickey_list *p;
  LIBSSH2_SESSION *session;
  libssh2_publickey_list *pkey_list_local;
  LIBSSH2_PUBLICKEY *pkey_local;
  
  if ((pkey != (LIBSSH2_PUBLICKEY *)0x0) && (pkey_list != (libssh2_publickey_list *)0x0)) {
    pLVar1 = pkey->channel->session;
    for (local_28 = pkey_list; local_28->packet != (uchar *)0x0; local_28 = local_28 + 1) {
      if (local_28->attrs != (libssh2_publickey_attribute *)0x0) {
        (*pLVar1->free)(local_28->attrs,&pLVar1->abstract);
      }
      (*pLVar1->free)(local_28->packet,&pLVar1->abstract);
    }
    (*pLVar1->free)(pkey_list,&pLVar1->abstract);
  }
  return;
}

Assistant:

LIBSSH2_API void
libssh2_publickey_list_free(LIBSSH2_PUBLICKEY * pkey,
                            libssh2_publickey_list * pkey_list)
{
    LIBSSH2_SESSION *session;
    libssh2_publickey_list *p = pkey_list;

    if(!pkey || !p)
        return;

    session = pkey->channel->session;

    while(p->packet) {
        if(p->attrs) {
            LIBSSH2_FREE(session, p->attrs);
        }
        LIBSSH2_FREE(session, p->packet);
        p++;
    }

    LIBSSH2_FREE(session, pkey_list);
}